

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

uint8 GetCellEdgeIncidenceMask(S2Cell *cell,S2Point *p,double tolerance_uv)

{
  double dVar1;
  bool bVar2;
  int face;
  ostream *poVar3;
  double *pdVar4;
  R1Interval *pRVar5;
  S2LogMessage local_90;
  S2LogMessageVoidify local_79;
  R2Rect local_78;
  undefined1 local_58 [8];
  R2Rect bound;
  R2Point uv;
  uint8 mask;
  double tolerance_uv_local;
  S2Point *p_local;
  S2Cell *cell_local;
  
  uv.c_[1]._7_1_ = 0;
  Vector2<double>::Vector2((Vector2<double> *)(bound.bounds_[1].bounds_.c_ + 1));
  face = S2Cell::face(cell);
  bVar2 = S2::FaceXYZtoUV(face,p,(R2Point *)(bound.bounds_[1].bounds_.c_ + 1));
  if (bVar2) {
    S2Cell::GetBoundUV((R2Rect *)local_58,cell);
    if ((FLAGS_s2debug & 1U) != 0) {
      R2Rect::Expanded(&local_78,(R2Rect *)local_58,tolerance_uv);
      bVar2 = R2Rect::Contains(&local_78,(R2Point *)(bound.bounds_[1].bounds_.c_ + 1));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x400,kFatal,(ostream *)&std::cerr);
        poVar3 = S2LogMessage::stream(&local_90);
        poVar3 = std::operator<<(poVar3,"Check failed: bound.Expanded(tolerance_uv).Contains(uv) ");
        S2LogMessageVoidify::operator&(&local_79,poVar3);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_90);
      }
    }
    pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)(bound.bounds_[1].bounds_.c_ + 1),1);
    dVar1 = *pdVar4;
    pRVar5 = R2Rect::operator[]((R2Rect *)local_58,1);
    pdVar4 = R1Interval::operator[](pRVar5,0);
    uv.c_[1]._7_1_ = ABS(dVar1 - *pdVar4) <= tolerance_uv;
    pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)(bound.bounds_[1].bounds_.c_ + 1),0);
    dVar1 = *pdVar4;
    pRVar5 = R2Rect::operator[]((R2Rect *)local_58,0);
    pdVar4 = R1Interval::operator[](pRVar5,1);
    if (ABS(dVar1 - *pdVar4) <= tolerance_uv) {
      uv.c_[1]._7_1_ = uv.c_[1]._7_1_ | 2;
    }
    pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)(bound.bounds_[1].bounds_.c_ + 1),1);
    dVar1 = *pdVar4;
    pRVar5 = R2Rect::operator[]((R2Rect *)local_58,1);
    pdVar4 = R1Interval::operator[](pRVar5,1);
    if (ABS(dVar1 - *pdVar4) <= tolerance_uv) {
      uv.c_[1]._7_1_ = uv.c_[1]._7_1_ | 4;
    }
    pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)(bound.bounds_[1].bounds_.c_ + 1),0);
    dVar1 = *pdVar4;
    pRVar5 = R2Rect::operator[]((R2Rect *)local_58,0);
    pdVar4 = R1Interval::operator[](pRVar5,0);
    if (ABS(dVar1 - *pdVar4) <= tolerance_uv) {
      uv.c_[1]._7_1_ = uv.c_[1]._7_1_ | 8;
    }
  }
  return uv.c_[1]._7_1_;
}

Assistant:

uint8 GetCellEdgeIncidenceMask(const S2Cell& cell, const S2Point& p,
                               double tolerance_uv) {
  uint8 mask = 0;
  R2Point uv;
  if (S2::FaceXYZtoUV(cell.face(), p, &uv)) {
    R2Rect bound = cell.GetBoundUV();
    if (FLAGS_s2debug) S2_DCHECK(bound.Expanded(tolerance_uv).Contains(uv));
    if (fabs(uv[1] - bound[1][0]) <= tolerance_uv) mask |= 1;
    if (fabs(uv[0] - bound[0][1]) <= tolerance_uv) mask |= 2;
    if (fabs(uv[1] - bound[1][1]) <= tolerance_uv) mask |= 4;
    if (fabs(uv[0] - bound[0][0]) <= tolerance_uv) mask |= 8;
  }
  return mask;
}